

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DnsStats.cpp
# Opt level: O3

void __thiscall DnsStats::ExportStatsByIp(DnsStats *this)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  bool bVar6;
  bool bVar7;
  uint uVar8;
  uint uVar9;
  uint64_t count;
  uint64_t count_00;
  uint uVar10;
  ulong uVar11;
  StatsByIP *this_00;
  uint64_t count_01;
  uint uVar12;
  uint64_t count_02;
  uint uVar13;
  uint64_t count_03;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint64_t local_80;
  uint64_t local_78;
  uint64_t local_70;
  uint64_t local_68;
  uint local_5c;
  uint64_t local_58;
  
  uVar8 = (this->statsByIp).tableSize;
  count_00 = 0;
  if (uVar8 == 0) {
    count = 0;
    local_78 = 0;
    count_01 = 0;
    local_68 = 0;
    local_70 = 0;
    count_02 = 0;
    uVar11 = 0;
    count_03 = 0;
    local_58 = 0;
    local_80 = 0;
  }
  else {
    uVar9 = 0;
    uVar11 = 0;
    local_5c = 0;
    uVar12 = 0;
    uVar14 = 0;
    uVar10 = 0;
    uVar3 = 0;
    uVar2 = 0;
    uVar13 = 0;
    uVar1 = 0;
    uVar15 = 0;
    uVar16 = 0;
    do {
      this_00 = (this->statsByIp).hashBin[uVar11];
      if (this_00 != (StatsByIP *)0x0) {
        do {
          bVar6 = this_00->query_seen;
          if (this_00->response_seen == true) {
            bVar7 = StatsByIP::IsDoUsed(this_00);
            uVar1 = uVar1 + bVar7;
            uVar13 = uVar13 + !bVar7;
            bVar7 = StatsByIP::IsEdnsSupported(this_00);
            uVar2 = uVar2 + bVar7;
            uVar3 = uVar3 + !bVar7;
            bVar7 = StatsByIP::IsQnameMinimized(this_00);
            uVar10 = uVar10 + bVar7;
            uVar14 = uVar14 + !bVar7;
            if (this_00->nb_recursive_queries == 0) {
              uVar9 = uVar9 + 1;
            }
            else {
              local_5c = local_5c + 1;
            }
          }
          uVar12 = uVar12 + bVar6;
          uVar4 = this_00->nb_tcp_443;
          uVar5 = this_00->nb_tcp_583;
          uVar15 = (uVar15 - (uVar4 == 0)) + 1;
          uVar16 = (uVar16 - (uVar5 == 0)) + 1;
          this_00 = this_00->HashNext;
        } while (this_00 != (StatsByIP *)0x0);
        uVar8 = (this->statsByIp).tableSize;
      }
      uVar11 = uVar11 + 1;
    } while (uVar11 < uVar8);
    count = (uint64_t)uVar13;
    local_80 = (uint64_t)uVar9;
    count_00 = (uint64_t)uVar1;
    count_01 = (uint64_t)uVar3;
    local_78 = (uint64_t)uVar2;
    local_70 = (uint64_t)uVar14;
    local_68 = (uint64_t)uVar10;
    local_58 = (uint64_t)local_5c;
    count_02 = (uint64_t)uVar12;
    uVar11 = (ulong)uVar16;
    count_03 = (uint64_t)uVar15;
  }
  SubmitRegistryNumberAndCount(this,0x29,0,count);
  SubmitRegistryNumberAndCount(this,0x29,1,count_00);
  SubmitRegistryNumberAndCount(this,0x2b,0,count_01);
  SubmitRegistryNumberAndCount(this,0x2b,1,local_78);
  SubmitRegistryNumberAndCount(this,0x2c,0,local_70);
  SubmitRegistryNumberAndCount(this,0x2c,1,local_68);
  SubmitRegistryNumberAndCount(this,0x41,0,local_80);
  SubmitRegistryNumberAndCount(this,0x41,1,local_58);
  SubmitRegistryNumberAndCount(this,0x2e,0,count_02);
  if (this->is_capture_dns_only == false) {
    SubmitRegistryNumberAndCount(this,0x30,0,(ulong)(this->statsByIp).tableSize);
    SubmitRegistryNumberAndCount(this,0x30,0x247,uVar11);
    SubmitRegistryNumberAndCount(this,0x30,0x1bb,count_03);
  }
  BinHash<StatsByIP>::Clear(&this->statsByIp);
  return;
}

Assistant:

void DnsStats::ExportStatsByIp()
{
    StatsByIP *sbi;
    uint32_t using_do_count = 0;
    uint32_t not_using_do_count = 0;
    uint32_t using_edns_count = 0;
    uint32_t not_using_edns_count = 0;
    uint32_t qname_minimizing_count = 0;
    uint32_t not_minimizing_count = 0;
    uint32_t total_queries = 0;
    uint32_t issued_syn_583 = 0;
    uint32_t issued_syn_443 = 0;
    uint32_t sending_recursive_count = 0;
    uint32_t not_sending_recursive_count = 0;

    for (uint32_t i = 0; i < statsByIp.GetSize(); i++)
    {
        sbi = statsByIp.GetEntry(i);

        while (sbi != NULL)
        {
            if (sbi->query_seen) {
                total_queries++;
            }

            if (sbi->response_seen) {
                if (sbi->IsDoUsed()) {
                    using_do_count++;
                }
                else {
                    not_using_do_count++;
                }

                if (sbi->IsEdnsSupported()) {
                    using_edns_count++;
                }
                else {
                    not_using_edns_count++;
                }

                if (sbi->IsQnameMinimized()) {
                    qname_minimizing_count++;
                }
                else {
                    not_minimizing_count++;
                }

                if (sbi->nb_recursive_queries > 0) {
                    sending_recursive_count++;
                }
                else {
                    not_sending_recursive_count++;
                }
            }

            if (sbi->nb_tcp_443 > 0) {
                issued_syn_443++;
            }

            if (sbi->nb_tcp_583 > 0) {
                issued_syn_583++;
            }

            sbi = sbi->HashNext;
        }
    }

    SubmitRegistryNumberAndCount(REGISTRY_DNSSEC_Client_Usage, 0, not_using_do_count);
    SubmitRegistryNumberAndCount(REGISTRY_DNSSEC_Client_Usage, 1, using_do_count);

    SubmitRegistryNumberAndCount(REGISTRY_EDNS_Client_Usage, 0, not_using_edns_count);
    SubmitRegistryNumberAndCount(REGISTRY_EDNS_Client_Usage, 1, using_edns_count);

    SubmitRegistryNumberAndCount(REGISTRY_QNAME_MINIMIZATION_Usage, 0, not_minimizing_count);
    SubmitRegistryNumberAndCount(REGISTRY_QNAME_MINIMIZATION_Usage, 1, qname_minimizing_count);

    SubmitRegistryNumberAndCount(REGISTRY_RESOLVER_SENDING_RECURSIVE, 0, not_sending_recursive_count);
    SubmitRegistryNumberAndCount(REGISTRY_RESOLVER_SENDING_RECURSIVE, 1, sending_recursive_count);

    SubmitRegistryNumberAndCount(REGISTRY_EDNS_OPT_USAGE_REF, 0, total_queries);

    if (!is_capture_dns_only) {
        /* Only add these counts if using PCAP directly, not DNSCAP */
        SubmitRegistryNumberAndCount(REGISTRY_TCPSYN_PER_PROTO, 0, statsByIp.GetSize());
        SubmitRegistryNumberAndCount(REGISTRY_TCPSYN_PER_PROTO, 583, issued_syn_583);
        SubmitRegistryNumberAndCount(REGISTRY_TCPSYN_PER_PROTO, 443, issued_syn_443);
    }

    statsByIp.Clear();
}